

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

bool __thiscall lan::db::str_compare(db *this,char target,string *content)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = content->_M_string_length;
  if (uVar1 == 0) {
    return false;
  }
  pcVar2 = (content->_M_dataplus)._M_p;
  bVar5 = true;
  if (*pcVar2 != target) {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (uVar1 == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (pcVar2[uVar4] != target);
    bVar5 = uVar4 < uVar1;
  }
  return bVar5;
}

Assistant:

bool db::str_compare(const char target, const std::string content){
            for(register_t i = 0 ; i < content.length() ; i++)
                if(content.data()[i] == target)
                    return true;
                return false;
        }